

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cc
# Opt level: O1

void __thiscall
google::protobuf::strings::GrowingArrayByteSink::Expand(GrowingArrayByteSink *this,size_t amount)

{
  char *__src;
  char *__dest;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = amount + this->capacity_;
  uVar2 = this->capacity_ * 3 >> 1;
  if (uVar2 < uVar1) {
    uVar2 = uVar1;
  }
  __dest = (char *)operator_new__(uVar2);
  __src = this->buf_;
  memcpy(__dest,__src,this->size_);
  if (__src != (char *)0x0) {
    operator_delete__(__src);
  }
  this->buf_ = __dest;
  this->capacity_ = uVar2;
  return;
}

Assistant:

void GrowingArrayByteSink::Expand(size_t amount) {  // Expand by at least 50%.
  size_t new_capacity = std::max(capacity_ + amount, (3 * capacity_) / 2);
  char* bigger = new char[new_capacity];
  memcpy(bigger, buf_, size_);
  delete[] buf_;
  buf_ = bigger;
  capacity_ = new_capacity;
}